

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int SaveEXRImageToFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  char *pcVar1;
  FILE *__s;
  size_t __n;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  uchar *mem;
  allocator local_69;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((filename == (char *)0x0 || exr_image == (EXRImage *)0x0) ||
     (exr_header->compression_type < 0)) {
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Invalid argument for SaveEXRImageToFile","");
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_68);
      *err = pcVar1;
    }
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    return -3;
  }
  if (exr_header->compression_type == 0x80) {
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"ZFP compression is not supported in this build","");
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_68);
      *err = pcVar1;
    }
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    return -10;
  }
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    std::__cxx11::string::string((string *)&local_48,filename,&local_69);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_48,0,0,"Cannot write a file: ",0x15);
    local_68 = (size_type *)(pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68 == paVar4) {
      local_58 = paVar4->_M_allocated_capacity;
      uStack_50 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_68 = &local_58;
    }
    else {
      local_58 = paVar4->_M_allocated_capacity;
    }
    local_60 = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_68);
      *err = pcVar1;
    }
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    _Var5._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return -0xb;
    }
  }
  else {
    local_48._M_dataplus._M_p = (pointer)0x0;
    __n = SaveEXRImageToMemory(exr_image,exr_header,(uchar **)&local_48,err);
    if (__n == 0) {
      return -0xc;
    }
    if ((size_type *)local_48._M_dataplus._M_p == (size_type *)0x0) {
      sVar2 = 0;
    }
    else {
      sVar2 = fwrite(local_48._M_dataplus._M_p,1,__n,__s);
    }
    free(local_48._M_dataplus._M_p);
    fclose(__s);
    if (sVar2 == __n) {
      return 0;
    }
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Cannot write a file","");
    if (err != (char **)0x0) {
      pcVar1 = strdup((char *)local_68);
      *err = pcVar1;
    }
    _Var5._M_p = (pointer)local_68;
    if (local_68 == &local_58) {
      return -0xb;
    }
  }
  operator_delete(_Var5._M_p);
  return -0xb;
}

Assistant:

int SaveEXRImageToFile(const EXRImage *exr_image, const EXRHeader *exr_header,
                       const char *filename, const char **err) {
  if (exr_image == NULL || filename == NULL ||
      exr_header->compression_type < 0) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRImageToFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#if !TINYEXR_USE_PIZ
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    tinyexr::SetErrorMessage("PIZ compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

#if !TINYEXR_USE_ZFP
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    tinyexr::SetErrorMessage("ZFP compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || defined(__MINGW32__)  // MSVC, MinGW gcc or clang
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"wb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }
#else
  // Unknown compiler
  fp = fopen(filename, "wb");
#endif
#else
  fp = fopen(filename, "wb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRImageToMemory(exr_image, exr_header, &mem, err);
  if (mem_size == 0) {
    return TINYEXR_ERROR_SERIALZATION_FAILED;
  }

  size_t written_size = 0;
  if ((mem_size > 0) && mem) {
    written_size = fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  if (written_size != mem_size) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  return TINYEXR_SUCCESS;
}